

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBezierCurve.cpp
# Opt level: O3

ChVector<double> * __thiscall
chrono::ChBezierCurve::calcClosestPoint
          (ChVector<double> *__return_storage_ptr__,ChBezierCurve *this,ChVector<double> *loc,
          size_t i,double *t)

{
  bool bVar1;
  ChVector<double> *pCVar2;
  int iVar3;
  int j;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  ChVector<double> local_80;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  ChVector<double> *local_40;
  double local_38;
  
  auVar8 = ZEXT816(0x7fefffffffffffff);
  dVar7 = 0.0;
  iVar3 = -1;
  iVar4 = 0;
  local_40 = __return_storage_ptr__;
  do {
    local_68._0_8_ = dVar7;
    local_58._0_8_ = auVar8._0_8_;
    eval(&local_80,this,i,dVar7 * 0.05);
    dVar7 = local_80.m_data[1] - loc->m_data[1];
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_80.m_data[0] - loc->m_data[0];
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar7 * dVar7;
    auVar8 = vfmadd231sd_fma(auVar13,auVar8,auVar8);
    dVar7 = (double)local_68._0_8_ + 1.0;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = local_80.m_data[2] - loc->m_data[2];
    auVar13 = vfmadd231sd_fma(auVar8,auVar16,auVar16);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = local_58._0_8_;
    auVar8 = vminsd_avx(auVar13,auVar17);
    if (auVar13._0_8_ < (double)local_58._0_8_) {
      iVar3 = iVar4;
    }
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0x15);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (double)(iVar3 + -1) * 0.05;
  auVar5 = vmaxsd_avx(ZEXT816(0) << 0x40,auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = (double)(iVar3 + 1) * 0.05;
  auVar6 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar10);
  if (auVar6._0_8_ - auVar5._0_8_ <= 1e-05) {
    dVar7 = *t;
  }
  else {
    do {
      dVar7 = (auVar5._0_8_ + auVar6._0_8_) * 0.5;
      *t = dVar7;
      local_68 = auVar6;
      local_58 = auVar5;
      eval(&local_80,this,i,dVar7 + -1e-05);
      dVar7 = local_80.m_data[1] - loc->m_data[1];
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_80.m_data[0] - loc->m_data[0];
      auVar14._8_8_ = 0;
      auVar14._0_8_ = dVar7 * dVar7;
      auVar8 = vfmadd231sd_fma(auVar14,auVar11,auVar11);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_80.m_data[2] - loc->m_data[2];
      auVar8 = vfmadd231sd_fma(auVar8,auVar18,auVar18);
      local_38 = auVar8._0_8_;
      eval(&local_80,this,i,*t + 1e-05);
      dVar7 = local_80.m_data[1] - loc->m_data[1];
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_80.m_data[0] - loc->m_data[0];
      auVar15._8_8_ = 0;
      auVar15._0_8_ = dVar7 * dVar7;
      auVar8 = vfmadd231sd_fma(auVar15,auVar12,auVar12);
      dVar7 = *t;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_80.m_data[2] - loc->m_data[2];
      auVar8 = vfmadd231sd_fma(auVar8,auVar19,auVar19);
      bVar1 = local_38 < auVar8._0_8_;
      auVar5._0_8_ = (double)((ulong)bVar1 * local_58._0_8_ + (ulong)!bVar1 * (long)dVar7);
      auVar5._8_8_ = 0;
      auVar6._0_8_ = (double)((ulong)bVar1 * (long)dVar7 + (ulong)!bVar1 * local_68._0_8_);
      auVar6._8_8_ = local_68._8_8_;
    } while (1e-05 < auVar6._0_8_ - auVar5._0_8_);
  }
  pCVar2 = local_40;
  eval(local_40,this,i,dVar7);
  return pCVar2;
}

Assistant:

ChVector<> ChBezierCurve::calcClosestPoint(const ChVector<>& loc, size_t i, double& t) const {
    // Bracket location of projection
    int m_numEvals = 20;
    double dt = 1.0 / m_numEvals;
    int min_idx = -1;
    double d2_min = std::numeric_limits<double>::max();
    for (int j = 0; j <= m_numEvals; j++) {
        double d2 = (eval(i, j * dt) - loc).Length2();
        if (d2 < d2_min) {
            min_idx = j;
            d2_min = d2;
        }
    }

    // Bisection
    int count = m_numEvals + 1;
    double t0 = std::max((min_idx - 1) * dt, 0.0);
    double t1 = std::min((min_idx + 1) * dt, 1.0);
    while (t1 - t0 > m_paramTol) {
        t = (t0 + t1) / 2;
        double d2_0 = (eval(i, t - m_paramTol) - loc).Length2();
        double d2_1 = (eval(i, t + m_paramTol) - loc).Length2();
        if (d2_0 < d2_1)
            t1 = t;
        else
            t0 = t;
        count += 2;
    }

    ////std::cout << "num. evaluations: " << count << std::endl;

    return eval(i, t);

    /*
    // Newton method
    ChVector<> Q = eval(i, t);
    ChVector<> Qd;
    ChVector<> Qdd;

    size_t j = 0;
    for (j = 0; j < m_maxNumIters; j++) {
        ChVector<> vec = Q - loc;
        double d2 = vec.Length2();

        if (d2 < m_sqrDistTol)
            break;

        Qd = evalD(i, t);

        double dot = Vdot(vec, Qd);
        double cosAngle = dot / (std::sqrt(d2) * Qd.Length());

        if (fabs(cosAngle) < m_cosAngleTol)
            break;

        Qdd = evalDD(i, t);

        double dt = dot / (Vdot(vec, Qdd) + Qd.Length2());

        t -= dt;

        Q = eval(i, t);

        if ((dt * Qd).Length2() < m_sqrDistTol)
            break;
    }

    ////std::cout << "num iterations: " << j << "   max: " << m_maxNumIters << std::endl;

    if (t < m_paramTol || t > 1 - m_paramTol) {
        ChClampValue(t, 0.0, 1.0);
        Q = eval(i, t);
    } else {
        ChVector<> Q_0 = eval(i, 0.0);
        ChVector<> Q_1 = eval(i, 1.0);

        double d2 = (Q - loc).Length2();
        double d2_0 = (Q_0 - loc).Length2();
        double d2_1 = (Q_1 - loc).Length2();

        if (d2_0 < d2) {
            t = 0;
            Q = Q_0;
            d2 = d2_0;
        }
        if (d2_1 < d2) {
            t = 1;
            Q = Q_1;
        }
    }

    return Q;
    */
}